

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void liveness_pass_1(TCGContext_conflict9 *s)

{
  TCGArg *pTVar1;
  byte *pbVar2;
  uint ng;
  uint nt;
  TCGOp *pTVar3;
  TCGOpDef *pTVar4;
  uint *puVar5;
  TCGArg TVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  byte bVar18;
  TCGRegSet TVar19;
  TCGOp *op;
  TCGTemp *ts;
  TCGTemp *pTVar20;
  uint uVar21;
  ulong uVar22;
  undefined2 uVar23;
  bool bVar24;
  long lStack_90;
  
  ng = s->nb_globals;
  nt = s->nb_temps;
  pvVar10 = tcg_malloc(s,nt * 4);
  lVar13 = 0;
  uVar15 = 0;
  if (0 < (int)nt) {
    uVar15 = (ulong)nt;
  }
  for (; uVar15 * 0xe - lVar13 != 0; lVar13 = lVar13 + 0xe) {
    *(void **)((long)&s->temps[0].state_ptr + lVar13 * 4) = pvVar10;
    pvVar10 = (void *)((long)pvVar10 + 4);
  }
  la_func_end(s,ng,nt);
  uVar15 = 0;
  if (0 < (int)ng) {
    uVar15 = (ulong)ng;
  }
  op = (TCGOp *)((s->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
  do {
    if (op == (TCGOp *)0x0) {
      return;
    }
    pTVar3 = (TCGOp *)((op->link).tqe_circ.tql_prev)->tql_prev->tql_next;
    uVar8 = *(uint *)op;
    uVar21 = uVar8 & 0xff;
    uVar7 = (uVar8 & 0xff) << 5;
    pTVar4 = s->tcg_op_defs;
    switch(uVar8 & 0xff) {
    case 0x7b:
      uVar9 = 0x4e;
      break;
    case 0x7c:
      uVar9 = 0x4f;
      break;
    case 0x7d:
    case 0x7e:
      uVar9 = 0x50;
LAB_00b25ad8:
      bVar12 = 2;
      bVar18 = 2;
      if (*(long *)(op->args[1] + 0x28) != 1) goto LAB_00b25bb6;
      lVar13 = *(long *)(op->args[0] + 0x28);
      lStack_90 = 0x30;
      goto LAB_00b25b73;
    case 0x7f:
    case 0x80:
switchD_00b25ad3_caseD_7f:
      bVar12 = (&pTVar4->nb_oargs)[uVar7];
      bVar18 = (&pTVar4->nb_iargs)[uVar7];
      if (bVar12 != 0 && ((&pTVar4->flags)[uVar7] & 8) == 0) {
        uVar16 = 0;
        do {
          if (bVar12 == uVar16) goto LAB_00b25b76;
          pTVar1 = op->args + uVar16;
          uVar16 = uVar16 + 1;
        } while (*(long *)(*pTVar1 + 0x28) == 1);
      }
      goto LAB_00b25bb6;
    case 0x81:
      goto switchD_00b25ad3_caseD_81;
    default:
      uVar9 = 0x13;
      if ((uVar8 & 0xff) - 0x29 < 2) goto LAB_00b25ad8;
      uVar17 = uVar8 & 0xff;
      if ((uVar8 & 0xff) == 0) {
        pTVar20 = (TCGTemp *)op->args[0];
        pTVar20->state = 1;
        la_reset_pref(s,pTVar20);
        goto switchD_00b25ad3_caseD_81;
      }
      if (uVar17 == 0x28) {
        uVar9 = 0x12;
        break;
      }
      uVar9 = 0x11;
      if (uVar17 == 0x27) break;
      if (uVar17 != 2) goto switchD_00b25ad3_caseD_7f;
      uVar21 = uVar8 >> 0xc & 0xf;
      uVar22 = (ulong)uVar21;
      uVar8 = uVar8 >> 8 & 0xf;
      uVar16 = (ulong)(uVar21 + uVar8);
      TVar6 = op->args[uVar16 + 1];
      if ((TVar6 & 4) != 0) {
        uVar11 = 0;
        do {
          if (uVar22 == uVar11) goto LAB_00b25b76;
          pTVar1 = op->args + uVar11;
          uVar11 = uVar11 + 1;
        } while (*(long *)(*pTVar1 + 0x28) == 1);
      }
      uVar21 = 0;
      for (uVar11 = 0; uVar22 != uVar11; uVar11 = uVar11 + 1) {
        pTVar20 = (TCGTemp *)op->args[uVar11];
        uVar7 = 0;
        if ((pTVar20->state & 1) != 0) {
          uVar7 = 4 << ((byte)uVar11 & 0x1f);
        }
        uVar9 = 0;
        if ((pTVar20->state & 2) != 0) {
          uVar9 = 1 << ((byte)uVar11 & 0x1f);
        }
        uVar21 = uVar21 | uVar9 | uVar7;
        pTVar20->state = 1;
        la_reset_pref(s,pTVar20);
        op->output_pref[uVar11] = 0;
      }
      uVar14 = uVar15;
      pTVar20 = s->temps;
      uVar11 = uVar22;
      if ((TVar6 & 3) == 0) {
        while (uVar14 != 0) {
          pTVar20->state = 3;
          la_reset_pref(s,pTVar20);
          uVar14 = uVar14 - 1;
          pTVar20 = pTVar20 + 1;
        }
      }
      else if ((TVar6 & 1) == 0) {
        la_global_sync(s,ng);
      }
      for (; uVar23 = (undefined2)uVar21, uVar11 < uVar16; uVar11 = uVar11 + 1) {
        if ((op->args[uVar11] != 0) && ((*(byte *)(op->args[uVar11] + 0x28) & 1) != 0)) {
          uVar21 = uVar21 | 4 << ((byte)uVar11 & 0x1f);
        }
      }
      la_cross_call(s,nt);
      for (uVar16 = 0; uVar8 != uVar16; uVar16 = uVar16 + 1) {
        TVar6 = op->args[uVar22 + uVar16];
        if ((TVar6 != 0) && (uVar11 = *(ulong *)(TVar6 + 0x28), (uVar11 & 1) != 0)) {
          TVar19 = 0;
          if (5 < uVar16) {
            TVar19 = s->tcg_target_available_regs[*(byte *)(TVar6 + 3)];
          }
          **(TCGRegSet **)(TVar6 + 0x30) = TVar19;
          *(ulong *)(TVar6 + 0x28) = uVar11 & 0xfffffffffffffffe;
        }
      }
      if (5 < uVar8) {
        uVar8 = 6;
      }
      for (uVar16 = 0; uVar8 << 2 != uVar16; uVar16 = uVar16 + 4) {
        lVar13 = *(long *)((long)op->args + uVar16 * 2 + uVar22 * 8);
        if (lVar13 != 0) {
          puVar5 = *(uint **)(lVar13 + 0x30);
          *puVar5 = *puVar5 | 1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar16) & 0x1f);
        }
      }
      goto LAB_00b25d3d;
    }
    if (*(long *)(op->args[1] + 0x28) == 1) {
      lVar13 = *(long *)(op->args[0] + 0x28);
      lStack_90 = 0x38;
LAB_00b25b73:
      if (lVar13 != 1) {
        *(uint *)op = uVar8 & 0xffffff00 | uVar9;
        op->args[1] = op->args[2];
        op->args[2] = *(TCGArg *)((long)op->args + lStack_90 + -0x18);
        bVar18 = 2;
        bVar12 = 1;
        uVar21 = uVar9;
        goto LAB_00b25bb6;
      }
LAB_00b25b76:
      tcg_op_remove_tricore(s,op);
switchD_00b25ad3_caseD_81:
      uVar23 = 0;
    }
    else {
      bVar18 = 4;
      bVar12 = 2;
LAB_00b25bb6:
      uVar22 = (ulong)bVar12;
      uVar8 = 0;
      for (uVar16 = 0; uVar22 != uVar16; uVar16 = uVar16 + 1) {
        pTVar20 = (TCGTemp *)op->args[uVar16];
        op->output_pref[uVar16] = *pTVar20->state_ptr;
        uVar9 = 4 << ((byte)uVar16 & 0x1f);
        if ((pTVar20->state & 1) == 0) {
          uVar9 = 0;
        }
        uVar17 = 1 << ((byte)uVar16 & 0x1f);
        if ((pTVar20->state & 2) == 0) {
          uVar17 = 0;
        }
        uVar8 = uVar8 | uVar17 | uVar9;
        pTVar20->state = 1;
        la_reset_pref(s,pTVar20);
      }
      bVar12 = (&pTVar4->flags)[uVar7];
      if ((bVar12 & 1) == 0) {
        if ((bVar12 & 2) == 0) {
          if (((bVar12 & 8) != 0) && (la_global_sync(s,ng), ((&pTVar4->flags)[uVar7] & 4) != 0)) {
            la_cross_call(s,nt);
          }
        }
        else {
          uVar16 = uVar15;
          pTVar20 = s->temps;
          if (uVar21 == 0x26) {
            for (lVar13 = 0; uVar15 * 0x38 != lVar13; lVar13 = lVar13 + 0x38) {
              pbVar2 = (byte *)((long)&s->temps[0].state + lVar13);
              *pbVar2 = *pbVar2 | 2;
            }
          }
          else {
            while (bVar24 = uVar16 != 0, uVar16 = uVar16 - 1, lVar13 = (long)(int)ng,
                  ts = s->temps + (int)ng, bVar24) {
              pTVar20->state = 3;
              la_reset_pref(s,pTVar20);
              pTVar20 = pTVar20 + 1;
            }
            for (; lVar13 < (int)nt; lVar13 = lVar13 + 1) {
              ts->state = (ulong)((uint)((ulong)*(undefined8 *)ts >> 0x26) & 1) * 2 + 1;
              la_reset_pref(s,ts);
              ts = ts + 1;
            }
          }
        }
      }
      else {
        la_func_end(s,ng,nt);
      }
      uVar11 = bVar18 + uVar22;
      for (uVar16 = uVar22; uVar23 = (undefined2)uVar8, uVar14 = uVar22, uVar16 < uVar11;
          uVar16 = uVar16 + 1) {
        uVar9 = 0;
        if ((*(byte *)(op->args[uVar16] + 0x28) & 1) != 0) {
          uVar9 = 4 << ((byte)uVar16 & 0x1f);
        }
        uVar8 = uVar8 | uVar9;
      }
      for (; uVar14 < uVar11; uVar14 = uVar14 + 1) {
        TVar6 = op->args[uVar14];
        uVar16 = *(ulong *)(TVar6 + 0x28);
        if ((uVar16 & 1) != 0) {
          **(TCGRegSet **)(TVar6 + 0x30) = s->tcg_target_available_regs[*(byte *)(TVar6 + 3)];
          *(ulong *)(TVar6 + 0x28) = uVar16 & 0xfffffffffffffffe;
        }
      }
      if ((uVar21 == 5) || (uVar21 == 0x3f)) {
        if ((uVar8 & 8) != 0) {
          **(undefined4 **)(op->args[0] + 0x30) = **(undefined4 **)(op->args[1] + 0x30);
        }
      }
      else {
        for (; uVar22 < uVar11; uVar22 = uVar22 + 1) {
          lVar13 = *(long *)((long)&pTVar4->args_ct + (ulong)uVar7);
          puVar5 = *(uint **)(op->args[uVar22] + 0x30);
          uVar8 = *(uint *)(lVar13 + 4 + uVar22 * 8);
          uVar21 = *puVar5 & uVar8;
          if ((*(byte *)(lVar13 + uVar22 * 8) & 0x40) != 0) {
            uVar21 = uVar21 & op->output_pref[*(byte *)(lVar13 + 2 + uVar22 * 8)];
          }
          if (uVar21 != 0) {
            uVar8 = uVar21;
          }
          *puVar5 = uVar8;
        }
      }
    }
LAB_00b25d3d:
    *(undefined2 *)&op->field_0x2 = uVar23;
    op = pTVar3;
  } while( true );
}

Assistant:

static void liveness_pass_1(TCGContext *s)
{
    int nb_globals = s->nb_globals;
    int nb_temps = s->nb_temps;
    TCGOp *op, *op_prev;
    TCGRegSet *prefs;
    int i;

    prefs = tcg_malloc(s, sizeof(TCGRegSet) * nb_temps);
    for (i = 0; i < nb_temps; ++i) {
        s->temps[i].state_ptr = prefs + i;
    }

    /* ??? Should be redundant with the exit_tb that ends the TB.  */
    la_func_end(s, nb_globals, nb_temps);

    QTAILQ_FOREACH_REVERSE_SAFE(op, &s->ops, link, op_prev) {
        int nb_iargs, nb_oargs;
        TCGOpcode opc_new, opc_new2;
        bool have_opc_new2;
        TCGLifeData arg_life = 0;
        TCGTemp *ts;
        TCGOpcode opc = op->opc;
        const TCGOpDef *def = &s->tcg_op_defs[opc];

        switch (opc) {
        case INDEX_op_call:
            {
                int call_flags;
                int nb_call_regs;

                nb_oargs = TCGOP_CALLO(op);
                nb_iargs = TCGOP_CALLI(op);
                call_flags = op->args[nb_oargs + nb_iargs + 1];

                /* pure functions can be removed if their result is unused */
                if (call_flags & TCG_CALL_NO_SIDE_EFFECTS) {
                    for (i = 0; i < nb_oargs; i++) {
                        ts = arg_temp(op->args[i]);
                        if (ts->state != TS_DEAD) {
                            goto do_not_remove_call;
                        }
                    }
                    goto do_remove;
                }
            do_not_remove_call:

                /* Output args are dead.  */
                for (i = 0; i < nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                    if (ts->state & TS_MEM) {
                        arg_life |= SYNC_ARG << i;
                    }
                    ts->state = TS_DEAD;
                    la_reset_pref(s, ts);

                    /* Not used -- it will be tcg_target_call_oarg_regs[i].  */
                    op->output_pref[i] = 0;
                }

                if (!(call_flags & (TCG_CALL_NO_WRITE_GLOBALS |
                                    TCG_CALL_NO_READ_GLOBALS))) {
                    la_global_kill(s, nb_globals);
                } else if (!(call_flags & TCG_CALL_NO_READ_GLOBALS)) {
                    la_global_sync(s, nb_globals);
                }

                /* Record arguments that die in this helper.  */
                for (i = nb_oargs; i < nb_iargs + nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts && ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                }

                /* For all live registers, remove call-clobbered prefs.  */
                la_cross_call(s, nb_temps);

                nb_call_regs = ARRAY_SIZE(tcg_target_call_iarg_regs);

                /* Input arguments are live for preceding opcodes.  */
                for (i = 0; i < nb_iargs; i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts && ts->state & TS_DEAD) {
                        /* For those arguments that die, and will be allocated
                         * in registers, clear the register set for that arg,
                         * to be filled in below.  For args that will be on
                         * the stack, reset to any available reg.
                         */
                        *la_temp_pref(ts)
                            = (i < nb_call_regs ? 0 :
                               s->tcg_target_available_regs[ts->type]);
                        ts->state &= ~TS_DEAD;
                    }
                }

                /* For each input argument, add its input register to prefs.
                   If a temp is used once, this produces a single set bit.  */
                for (i = 0; i < MIN(nb_call_regs, nb_iargs); i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts) {
                        tcg_regset_set_reg(*la_temp_pref(ts),
                                           tcg_target_call_iarg_regs[i]);
                    }
                }
            }
            break;
        case INDEX_op_insn_start:
            break;
        case INDEX_op_discard:
            /* mark the temporary as dead */
            ts = arg_temp(op->args[0]);
            ts->state = TS_DEAD;
            la_reset_pref(s, ts);
            break;

        case INDEX_op_add2_i32:
            opc_new = INDEX_op_add_i32;
            goto do_addsub2;
        case INDEX_op_sub2_i32:
            opc_new = INDEX_op_sub_i32;
            goto do_addsub2;
        case INDEX_op_add2_i64:
            opc_new = INDEX_op_add_i64;
            goto do_addsub2;
        case INDEX_op_sub2_i64:
            opc_new = INDEX_op_sub_i64;
        do_addsub2:
            nb_iargs = 4;
            nb_oargs = 2;
            /* Test if the high part of the operation is dead, but not
               the low part.  The result can be optimized to a simple
               add or sub.  This happens often for x86_64 guest when the
               cpu mode is set to 32 bit.  */
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    goto do_remove;
                }
                /* Replace the opcode and adjust the args in place,
                   leaving 3 unused args at the end.  */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[4];
                /* Fall through and mark the single-word operation live.  */
                nb_iargs = 2;
                nb_oargs = 1;
            }
            goto do_not_remove;

        case INDEX_op_mulu2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_muluh_i32;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i32;
            goto do_mul2;
        case INDEX_op_muls2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_mulsh_i32;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i32;
            goto do_mul2;
        case INDEX_op_mulu2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_muluh_i64;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i64;
            goto do_mul2;
        case INDEX_op_muls2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_mulsh_i64;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i64;
            goto do_mul2;
        do_mul2:
            nb_iargs = 2;
            nb_oargs = 2;
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    /* Both parts of the operation are dead.  */
                    goto do_remove;
                }
                /* The high part of the operation is dead; generate the low. */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else if (arg_temp(op->args[0])->state == TS_DEAD && have_opc_new2) {
                /* The low part of the operation is dead; generate the high. */
                op->opc = opc = opc_new2;
                op->args[0] = op->args[1];
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else {
                goto do_not_remove;
            }
            /* Mark the single-word operation live.  */
            nb_oargs = 1;
            goto do_not_remove;

        default:
            /* XXX: optimize by hardcoding common cases (e.g. triadic ops) */
            nb_iargs = def->nb_iargs;
            nb_oargs = def->nb_oargs;

            /* Test if the operation can be removed because all
               its outputs are dead. We assume that nb_oargs == 0
               implies side effects */
            if (!(def->flags & TCG_OPF_SIDE_EFFECTS) && nb_oargs != 0) {
                for (i = 0; i < nb_oargs; i++) {
                    if (arg_temp(op->args[i])->state != TS_DEAD) {
                        goto do_not_remove;
                    }
                }
                goto do_remove;
            }
            goto do_not_remove;

        do_remove:
            tcg_op_remove(s, op);
            break;

        do_not_remove:
            for (i = 0; i < nb_oargs; i++) {
                ts = arg_temp(op->args[i]);

                /* Remember the preference of the uses that followed.  */
                op->output_pref[i] = *la_temp_pref(ts);

                /* Output args are dead.  */
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
                if (ts->state & TS_MEM) {
                    arg_life |= SYNC_ARG << i;
                }
                ts->state = TS_DEAD;
                la_reset_pref(s, ts);
            }

            /* If end of basic block, update.  */
            if (def->flags & TCG_OPF_BB_EXIT) {
                la_func_end(s, nb_globals, nb_temps);
            } else if (def->flags & TCG_OPF_BB_END) {
                // Unicorn: do not optimize dead temps on brcond,
                // this causes problem because check_exit_request() inserts
                // brcond instruction in the middle of the TB,
                // which incorrectly flags end-of-block
                if (opc != INDEX_op_brcond_i32) {
                    la_bb_end(s, nb_globals, nb_temps);
                } else {
                    // Unicorn: we do not touch dead temps for brcond,
                    // but we should refresh TCG globals In-Memory states,
                    // otherwise, important CPU states(especially conditional flags) might be forgotten,
                    // result in wrongly generated host code that run into wrong branch.
                    // Refer to https://github.com/unicorn-engine/unicorn/issues/287 for further information
                    la_brcond_end(s, nb_globals);
                }
            } else if (def->flags & TCG_OPF_SIDE_EFFECTS) {
                la_global_sync(s, nb_globals);
                if (def->flags & TCG_OPF_CALL_CLOBBER) {
                    la_cross_call(s, nb_temps);
                }
            }

            /* Record arguments that die in this opcode.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
            }

            /* Input arguments are live for preceding opcodes.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    /* For operands that were dead, initially allow
                       all regs for the type.  */
                    *la_temp_pref(ts) = s->tcg_target_available_regs[ts->type];
                    ts->state &= ~TS_DEAD;
                }
            }

            /* Incorporate constraints for this operand.  */
            switch (opc) {
            case INDEX_op_mov_i32:
            case INDEX_op_mov_i64:
                /* Note that these are TCG_OPF_NOT_PRESENT and do not
                   have proper constraints.  That said, special case
                   moves to propagate preferences backward.  */
                if (IS_DEAD_ARG(1)) {
                    *la_temp_pref(arg_temp(op->args[0]))
                        = *la_temp_pref(arg_temp(op->args[1]));
                }
                break;

            default:
                for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                    const TCGArgConstraint *ct = &def->args_ct[i];
                    TCGRegSet set, *pset;

                    ts = arg_temp(op->args[i]);
                    pset = la_temp_pref(ts);
                    set = *pset;

                    set &= ct->u.regs;
                    if (ct->ct & TCG_CT_IALIAS) {
                        set &= op->output_pref[ct->alias_index];
                    }
                    /* If the combination is not possible, restart.  */
                    if (set == 0) {
                        set = ct->u.regs;
                    }
                    *pset = set;
                }
                break;
            }
            break;
        }
        op->life = arg_life;
    }
}